

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall FIX::Session::disconnect(Session *this)

{
  Mutex *__mutex;
  SessionState *this_00;
  int iVar1;
  undefined8 uVar2;
  string local_60;
  string local_40;
  
  __mutex = &this->m_mutex;
  Mutex::lock(__mutex);
  if (this->m_pResponder != (Responder *)0x0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Disconnecting","");
    SessionState::onEvent(&this->m_state,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    (*this->m_pResponder->_vptr_Responder[3])();
    this->m_pResponder = (Responder *)0x0;
  }
  if (((this->m_state).m_receivedLogon != false) || ((this->m_state).m_sentLogon == true)) {
    (this->m_state).m_receivedLogon = false;
    (this->m_state).m_sentLogon = false;
    (**(code **)(*(long *)this->m_application + 0x20))(this->m_application,&this->m_sessionID);
  }
  this_00 = &this->m_state;
  (this->m_state).m_sentLogout = false;
  (this->m_state).m_sentReset = false;
  (this->m_state).m_receivedReset = false;
  SessionState::clearQueue(this_00);
  SessionState::logoutReason_abi_cxx11_(&local_40,this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (this->m_resetOnDisconnect == true) {
    if ((this->m_timestamper).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar2 = std::__throw_bad_function_call();
      iVar1 = (this->m_mutex).m_count;
      (this->m_mutex).m_count = iVar1 + -1;
      if (iVar1 < 2) {
        (this->m_mutex).m_threadID = 0;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      _Unwind_Resume(uVar2);
    }
    (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)&local_60,(_Any_data *)&this->m_timestamper)
    ;
    SessionState::reset(this_00,(UtcTimeStamp *)&local_60);
  }
  (this->m_state).m_resendRange.first = 0;
  (this->m_state).m_resendRange.second = 0;
  iVar1 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar1 + -1;
  if (iVar1 < 2) {
    (this->m_mutex).m_threadID = 0;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void Session::disconnect() {
  Locker l(m_mutex);

  if (m_pResponder) {
    m_state.onEvent("Disconnecting");

    m_pResponder->disconnect();
    m_pResponder = 0;
  }

  if (m_state.receivedLogon() || m_state.sentLogon()) {
    m_state.receivedLogon(false);
    m_state.sentLogon(false);
    m_application.onLogout(m_sessionID);
  }

  m_state.sentLogout(false);
  m_state.receivedReset(false);
  m_state.sentReset(false);
  m_state.clearQueue();
  m_state.logoutReason();
  if (m_resetOnDisconnect) {
    m_state.reset(m_timestamper());
  }

  m_state.resendRange(0, 0);
}